

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

SQInteger __thiscall SQFuncState::GetOuterVariable(SQFuncState *this,SQObject *name)

{
  SQFuncState *this_00;
  SQObjectValue *pSVar1;
  SQOuterVar *pSVar2;
  ulong uVar3;
  SQUnsignedInteger *pSVar4;
  SQUnsignedInteger SVar5;
  ulong uVar6;
  SQInteger SVar7;
  SQObjectPtr local_68;
  SQObjectPtr local_58;
  SQOuterVar local_48;
  
  uVar3 = (this->_outervalues)._size;
  if (0 < (long)uVar3) {
    pSVar1 = &(((this->_outervalues)._vals)->_name).super_SQObject._unVal;
    uVar6 = 0;
    do {
      if (pSVar1->pTable == (name->_unVal).pTable) {
        return uVar6;
      }
      uVar6 = uVar6 + 1;
      pSVar1 = pSVar1 + 5;
    } while (uVar3 != uVar6);
  }
  this_00 = this->_parent;
  SVar7 = -1;
  if (this_00 != (SQFuncState *)0x0) {
    SVar5 = (this_00->_vlocals)._size;
    if (0 < (long)SVar5) {
      uVar6 = SVar5 + 1;
      pSVar4 = &(this_00->_vlocals)._vals[SVar5 - 1]._end_op;
      do {
        if (((((SQLocalVarInfo *)(pSVar4 + -3))->_name).super_SQObject._type == OT_STRING) &&
           (((SQObjectValue *)(pSVar4 + -2))->pTable == (name->_unVal).pTable)) {
          *pSVar4 = 0xffffffffffffffff;
          this_00->_outers = this_00->_outers + 1;
          local_58.super_SQObject._type = name->_type;
          local_58.super_SQObject._unVal = (SQObjectValue)(name->_unVal).pTable;
          local_68.super_SQObject._unVal.pTable = (SQTable *)(uVar6 - 2);
          if ((local_58.super_SQObject._type >> 0x1b & 1) != 0) {
            pSVar4 = &((local_58.super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar4 = *pSVar4 + 1;
          }
          local_68.super_SQObject._type = OT_INTEGER;
          if ((local_58.super_SQObject._type >> 0x1b & 1) != 0) {
            pSVar4 = &((local_58.super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar4 = *pSVar4 + 1;
          }
          local_48._src.super_SQObject._type = OT_INTEGER;
          local_48._type = otLOCAL;
          pSVar2 = (this->_outervalues)._vals;
          uVar6 = (this->_outervalues)._allocated;
          local_48._name.super_SQObject._type = local_58.super_SQObject._type;
          local_48._name.super_SQObject._unVal = local_58.super_SQObject._unVal;
          local_48._src.super_SQObject._unVal.pTable = local_68.super_SQObject._unVal.pTable;
          if (uVar6 <= uVar3) {
            SVar5 = 4;
            if (uVar3 * 2 != 0) {
              SVar5 = uVar3 * 2;
            }
            pSVar2 = (SQOuterVar *)sq_vm_realloc(pSVar2,uVar6 * 0x28,SVar5 * 0x28);
            (this->_outervalues)._vals = pSVar2;
            (this->_outervalues)._allocated = SVar5;
            uVar3 = (this->_outervalues)._size;
          }
          (this->_outervalues)._size = uVar3 + 1;
          SQOuterVar::SQOuterVar(pSVar2 + uVar3,&local_48);
          goto LAB_00117b4d;
        }
        uVar6 = uVar6 - 1;
        pSVar4 = pSVar4 + -5;
      } while (1 < uVar6);
    }
    local_68.super_SQObject._unVal.nInteger = GetOuterVariable(this_00,name);
    if (local_68.super_SQObject._unVal.pTable != (SQTable *)0xffffffffffffffff) {
      local_58.super_SQObject._type = name->_type;
      local_58.super_SQObject._unVal = (SQObjectValue)(name->_unVal).pTable;
      if ((local_58.super_SQObject._type >> 0x1b & 1) != 0) {
        pSVar4 = &((local_58.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar4 = *pSVar4 + 1;
      }
      local_68.super_SQObject._type = OT_INTEGER;
      if ((local_58.super_SQObject._type >> 0x1b & 1) != 0) {
        pSVar4 = &((local_58.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar4 = *pSVar4 + 1;
      }
      local_48._src.super_SQObject._type = OT_INTEGER;
      local_48._type = otOUTER;
      uVar3 = (this->_outervalues)._allocated;
      pSVar2 = (this->_outervalues)._vals;
      uVar6 = (this->_outervalues)._size;
      local_48._name.super_SQObject._type = local_58.super_SQObject._type;
      local_48._name.super_SQObject._unVal = local_58.super_SQObject._unVal;
      local_48._src.super_SQObject._unVal.nInteger = local_68.super_SQObject._unVal.nInteger;
      if (uVar3 <= uVar6) {
        SVar5 = 4;
        if (uVar6 * 2 != 0) {
          SVar5 = uVar6 * 2;
        }
        pSVar2 = (SQOuterVar *)sq_vm_realloc(pSVar2,uVar3 * 0x28,SVar5 * 0x28);
        (this->_outervalues)._vals = pSVar2;
        (this->_outervalues)._allocated = SVar5;
        uVar6 = (this->_outervalues)._size;
      }
      (this->_outervalues)._size = uVar6 + 1;
      SQOuterVar::SQOuterVar(pSVar2 + uVar6,&local_48);
LAB_00117b4d:
      SQObjectPtr::~SQObjectPtr(&local_48._src);
      SQObjectPtr::~SQObjectPtr(&local_48._name);
      SQObjectPtr::~SQObjectPtr(&local_68);
      SQObjectPtr::~SQObjectPtr(&local_58);
      SVar7 = (this->_outervalues)._size - 1;
    }
  }
  return SVar7;
}

Assistant:

SQInteger SQFuncState::GetOuterVariable(const SQObject &name)
{
    SQInteger outers = _outervalues.size();
    for(SQInteger i = 0; i<outers; i++) {
        if(_string(_outervalues[i]._name) == _string(name))
            return i;
    }
    SQInteger pos=-1;
    if(_parent) {
        pos = _parent->GetLocalVariable(name);
        if(pos == -1) {
            pos = _parent->GetOuterVariable(name);
            if(pos != -1) {
                _outervalues.push_back(SQOuterVar(name,SQObjectPtr(SQInteger(pos)),otOUTER)); //local
                return _outervalues.size() - 1;
            }
        }
        else {
            _parent->MarkLocalAsOuter(pos);
            _outervalues.push_back(SQOuterVar(name,SQObjectPtr(SQInteger(pos)),otLOCAL)); //local
            return _outervalues.size() - 1;


        }
    }
    return -1;
}